

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# candump.c
# Opt level: O0

int sprint_timestamp(char *ts_buffer,char timestamp,timeval *tv,timeval *last_tv)

{
  tm *__src;
  long *in_RCX;
  time_t *in_RDX;
  char in_SIL;
  char *in_RDI;
  timeval diff;
  char timestring [25];
  tm tm;
  int numchars;
  long local_98;
  long local_90;
  char local_88 [40];
  tm local_60;
  int local_24;
  long *local_20;
  time_t *local_18;
  char local_9;
  char *local_8;
  
  local_24 = 0;
  local_18 = in_RDX;
  local_8 = in_RDI;
  if (in_SIL == 'A') {
    __src = localtime(in_RDX);
    memcpy(&local_60,__src,0x38);
    strftime(local_88,0x18,"%Y-%m-%d %H:%M:%S",&local_60);
    local_24 = sprintf(local_8,"(%s.%06llu) ",local_88,local_18[1]);
  }
  else if (in_SIL == 'a') {
    local_24 = sprintf(in_RDI,"(%010llu.%06llu) ",*in_RDX,in_RDX[1]);
  }
  else if ((in_SIL == 'd') || (in_SIL == 'z')) {
    if (*in_RCX == 0) {
      *in_RCX = *in_RDX;
      in_RCX[1] = in_RDX[1];
    }
    local_98 = *in_RDX - *in_RCX;
    local_90 = in_RDX[1] - in_RCX[1];
    if (local_90 < 0) {
      local_98 = local_98 + -1;
      local_90 = local_90 + 1000000;
    }
    if (local_98 < 0) {
      local_90 = 0;
      local_98 = 0;
    }
    local_20 = in_RCX;
    local_9 = in_SIL;
    local_24 = sprintf(in_RDI,"(%03llu.%06llu) ",local_98,local_90);
    if (local_9 == 'd') {
      *local_20 = *local_18;
      local_20[1] = local_18[1];
    }
  }
  if (local_24 < 1) {
    *local_8 = '\0';
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int sprint_timestamp(char *ts_buffer, const char timestamp,
			    const struct timeval *tv, struct timeval *const last_tv)
{
	int numchars = 0;

	switch (timestamp) {
	case 'a': /* absolute with timestamp */
		numchars = sprintf(ts_buffer, "(%010llu.%06llu) ",
				   (unsigned long long)tv->tv_sec,
				   (unsigned long long)tv->tv_usec);
		break;

	case 'A': /* absolute with date */
	{
		struct tm tm;
		char timestring[25];

		tm = *localtime(&tv->tv_sec);
		strftime(timestring, 24, "%Y-%m-%d %H:%M:%S", &tm);
		numchars = sprintf(ts_buffer, "(%s.%06llu) ", timestring,
				   (unsigned long long)tv->tv_usec);
	}
	break;

	case 'd': /* delta */
	case 'z': /* starting with zero */
	{
		struct timeval diff;

		if (last_tv->tv_sec == 0) /* first init */
			*last_tv = *tv;
		diff.tv_sec = tv->tv_sec - last_tv->tv_sec;
		diff.tv_usec = tv->tv_usec - last_tv->tv_usec;
		if (diff.tv_usec < 0)
			diff.tv_sec--, diff.tv_usec += 1000000;
		if (diff.tv_sec < 0)
			diff.tv_sec = diff.tv_usec = 0;
		numchars = sprintf(ts_buffer, "(%03llu.%06llu) ",
				   (unsigned long long)diff.tv_sec,
				   (unsigned long long)diff.tv_usec);

		if (timestamp == 'd')
			*last_tv = *tv; /* update for delta calculation */
	}
	break;

	default: /* no timestamp output */
		break;
	}

	if (numchars <= 0) {
		ts_buffer[0] = 0; /* empty terminated string */
		numchars = 0;
	}

	return numchars;
}